

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walltime.cc
# Opt level: O0

WallTime benchmark::walltime::anon_unknown_1::ChronoWalltimeNow(void)

{
  rep rVar1;
  duration<double,_std::ratio<1L,_1L>_> local_20;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_18;
  duration<long,_std::ratio<1L,_1000000000L>_> local_10;
  duration now;
  
  local_18.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  local_10.__r = (rep_conflict)
                 std::chrono::
                 time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                 ::time_since_epoch(&local_18);
  local_20.__r = (rep)std::chrono::
                      duration_cast<std::chrono::duration<double,std::ratio<1l,1l>>,long,std::ratio<1l,1000000000l>>
                                (&local_10);
  rVar1 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_20);
  return rVar1;
}

Assistant:

WallTime ChronoWalltimeNow() {
  typedef ChooseClockType::type Clock;
  typedef std::chrono::duration<WallTime, std::chrono::seconds::period>
          FPSeconds;
  static_assert(std::chrono::treat_as_floating_point<WallTime>::value,
                "This type must be treated as a floating point type.");
  auto now = Clock::now().time_since_epoch();
  return std::chrono::duration_cast<FPSeconds>(now).count();
}